

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O1

void __thiscall
Diligent::SerializedPipelineStateImpl::Initialize<Diligent::RayTracingPipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,RayTracingPipelineStateCreateInfo *CreateInfo,
          PipelineStateArchiveInfo *ArchiveInfo)

{
  SerializedResourceSignatureImpl *pSVar1;
  IPipelineResourceSignature *pObj;
  ARCHIVE_DEVICE_DATA_FLAGS AVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  IMemoryAllocator *Allocator;
  size_t Size;
  char *Args_1;
  long lVar5;
  SerializedResourceSignatureImpl **ppSVar6;
  ARCHIVE_DEVICE_DATA_FLAGS AVar7;
  bool bVar8;
  string msg_1;
  string msg;
  IPipelineResourceSignature *DefaultSignatures [1];
  Serializer<(Diligent::SerializerMode)2> Ser;
  anon_class_24_3_3c7a8e98 SerializePsoCI;
  undefined1 local_c8 [32];
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  SerializedResourceSignatureImpl *local_68;
  Serializer<(Diligent::SerializerMode)2> local_60;
  RayTracingPipelineStateCreateInfo *local_48;
  string *local_40;
  SerializedPipelineStateImpl *local_38;
  
  AVar7 = ArchiveInfo->DeviceFlags;
  AVar2 = AVar7 & ~ARCHIVE_DEVICE_DATA_FLAG_GLES;
  if ((~AVar7 & 0xc) != 0) {
    AVar2 = AVar7;
  }
  (this->m_Data).Aux.NoShaderReflection =
       (bool)((char)ArchiveInfo->PSOFlags & PSO_ARCHIVE_FLAG_STRIP_REFLECTION);
  if (AVar2 != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
    do {
      AVar7 = -AVar2 & AVar2;
      uVar3 = AVar7 << 0x1e | AVar7 >> 2;
      if (uVar3 - 1 < 2) {
        PatchShadersGL<Diligent::RayTracingPipelineStateCreateInfo>(this,CreateInfo);
      }
      else {
        if (uVar3 == 0) {
          FormatString<char[53]>
                    (&local_a8,(char (*) [53])"ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur"
                    );
          DebugAssertionFailed
                    (local_a8._M_dataplus._M_p,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                     ,0xeb);
        }
        else {
          if (uVar3 == 4) {
            PatchShadersVk<Diligent::RayTracingPipelineStateCreateInfo>(this,CreateInfo);
            goto LAB_001ce188;
          }
          FormatString<char[30]>(&local_a8,(char (*) [30])"Unexpected render device type");
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,local_a8._M_dataplus._M_p,0,0,0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
LAB_001ce188:
      bVar8 = AVar7 != AVar2;
      AVar2 = AVar7 ^ AVar2;
    } while (bVar8);
  }
  if ((this->m_Data).Common.m_Ptr == (void *)0x0) {
    if ((CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount == 0) {
      if ((ArchiveInfo->DeviceFlags & (ARCHIVE_DEVICE_DATA_FLAG_GLES|ARCHIVE_DEVICE_DATA_FLAG_GL))
          != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
        PrepareDefaultSignatureGL<Diligent::RayTracingPipelineStateCreateInfo>(this,CreateInfo);
      }
    }
    else {
      (this->m_Data).DoNotPackSignatures = (bool)((byte)(char)ArchiveInfo->PSOFlags >> 1 & 1);
    }
    uVar3 = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
    ppSVar6 = (SerializedResourceSignatureImpl **)
              (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures;
    local_68 = (SerializedResourceSignatureImpl *)0x0;
    pSVar1 = (this->m_pDefaultSignature).m_pObject;
    if (pSVar1 != (SerializedResourceSignatureImpl *)0x0) {
      ppSVar6 = &local_68;
      uVar3 = 1;
      local_68 = pSVar1;
    }
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = 0;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
    ::resize(&this->m_Signatures,(ulong)uVar3);
    if (uVar3 != 0) {
      lVar5 = 0;
      do {
        pObj = *(IPipelineResourceSignature **)((long)ppSVar6 + lVar5);
        if (pObj == (IPipelineResourceSignature *)0x0) {
          FormatString<char[71]>
                    ((string *)local_c8,
                     (char (*) [71])
                     "This error should\'ve been caught by ValidatePipelineResourceSignatures");
          DebugAssertionFailed
                    ((Char *)local_c8._0_8_,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                     ,0x116);
          if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
        }
        RefCntAutoPtr<Diligent::IPipelineResourceSignature>::operator=
                  ((RefCntAutoPtr<Diligent::IPipelineResourceSignature> *)
                   ((long)&((this->m_Signatures).
                            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_pObject + lVar5),pObj);
        iVar4 = (*(pObj->super_IDeviceObject).super_IObject._vptr_IObject[4])(pObj);
        *(undefined8 *)((long)&local_a8._M_dataplus._M_p + lVar5) =
             *(undefined8 *)CONCAT44(extraout_var,iVar4);
        lVar5 = lVar5 + 8;
      } while ((ulong)uVar3 << 3 != lVar5);
    }
    local_40 = &local_a8;
    local_60.m_Start = (TPointer)0x0;
    local_60.m_End = (TPointer)0xffffffff;
    local_60.m_Ptr = (TPointer)0x0;
    local_48 = CreateInfo;
    local_38 = this;
    Initialize<Diligent::RayTracingPipelineStateCreateInfo>(Diligent::RayTracingPipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_48,&local_60);
    Allocator = GetRawAllocator();
    Size = Serializer<(Diligent::SerializerMode)2>::GetSize(&local_60);
    SerializedData::SerializedData((SerializedData *)local_c8,Size,Allocator);
    SerializedData::operator=(&(this->m_Data).Common,(SerializedData *)local_c8);
    SerializedData::~SerializedData((SerializedData *)local_c8);
    local_60.m_Start = (TPointer)(this->m_Data).Common.m_Ptr;
    Args_1 = *(char (*) [14])local_60.m_Start + (this->m_Data).Common.m_Size;
    local_60.m_End = (TPointer)Args_1;
    local_60.m_Ptr = local_60.m_Start;
    Initialize<Diligent::RayTracingPipelineStateCreateInfo>(Diligent::RayTracingPipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&local_48,(Serializer<(Diligent::SerializerMode)1> *)&local_60
              );
    if (local_60.m_Ptr != local_60.m_End) {
      FormatString<char[26],char[14]>
                ((string *)local_c8,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x803690
                 ,(char (*) [14])Args_1);
      DebugAssertionFailed
                ((Char *)local_c8._0_8_,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,299);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
    }
  }
  LOCK();
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_READY;
  UNLOCK();
  return;
}

Assistant:

void SerializedPipelineStateImpl::Initialize(const PSOCreateInfoType&        CreateInfo,
                                             const PipelineStateArchiveInfo& ArchiveInfo)
{
    auto DeviceBits = ArchiveInfo.DeviceFlags;
    if ((DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GL) != 0 && (DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GLES) != 0)
    {
        // OpenGL and GLES use the same device data. Clear one flag to avoid shader duplication.
        DeviceBits &= ~ARCHIVE_DEVICE_DATA_FLAG_GLES;
    }

    m_Data.Aux.NoShaderReflection = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_STRIP_REFLECTION) != 0;
    while (DeviceBits != 0)
    {
        const auto Flag = ExtractLSB(DeviceBits);

        static_assert(ARCHIVE_DEVICE_DATA_FLAG_LAST == 1 << 7, "Please update the switch below to handle the new data type");
        switch (Flag)
        {
#if D3D11_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D11:
                PatchShadersD3D11(CreateInfo);
                break;
#endif
#if D3D12_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D12:
                PatchShadersD3D12(CreateInfo);
                break;
#endif
#if GL_SUPPORTED || GLES_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_GL:
            case ARCHIVE_DEVICE_DATA_FLAG_GLES:
                PatchShadersGL(CreateInfo);
                break;
#endif
#if VULKAN_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_VULKAN:
                PatchShadersVk(CreateInfo);
                break;
#endif
#if METAL_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS:
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS:
                PatchShadersMtl(CreateInfo, ArchiveDeviceDataFlagToArchiveDeviceType(Flag),
                                GetPSODumpFolder(m_pSerializationDevice->GetMtlProperties().DumpFolder, GetDesc(), Flag));
                break;
#endif
#if WEBGPU_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_WEBGPU:
                PatchShadersWebGPU(CreateInfo);
                break;
#endif
            case ARCHIVE_DEVICE_DATA_FLAG_NONE:
                UNEXPECTED("ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur");
                break;

            default:
                LOG_ERROR_MESSAGE("Unexpected render device type");
                break;
        }
    }

    if (!m_Data.Common)
    {
        if (CreateInfo.ResourceSignaturesCount == 0)
        {
#if GL_SUPPORTED || GLES_SUPPORTED
            if (ArchiveInfo.DeviceFlags & (ARCHIVE_DEVICE_DATA_FLAG_GL | ARCHIVE_DEVICE_DATA_FLAG_GLES))
            {
                // We must add empty device signature for OpenGL after all other devices are processed,
                // otherwise this empty description will be used as common signature description.
                PrepareDefaultSignatureGL(CreateInfo);
            }
#endif
        }
        else
        {
            m_Data.DoNotPackSignatures = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_DO_NOT_PACK_SIGNATURES) != 0;
        }

        auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;
        auto** ppSignatures    = CreateInfo.ppResourceSignatures;

        IPipelineResourceSignature* DefaultSignatures[1] = {};
        if (m_pDefaultSignature)
        {
            DefaultSignatures[0] = m_pDefaultSignature;
            ppSignatures         = DefaultSignatures;
            SignaturesCount      = 1;
        }

        TPRSNames PRSNames = {};
        m_Signatures.resize(SignaturesCount);
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            auto* pSignature = ppSignatures[i];
            VERIFY(pSignature != nullptr, "This error should've been caught by ValidatePipelineResourceSignatures");
            m_Signatures[i] = pSignature;
            PRSNames[i]     = pSignature->GetDesc().Name;
        }

        auto SerializePsoCI = [&](auto& Ser) //
        {
            SerializePSOCreateInfo(Ser, CreateInfo, PRSNames);
            constexpr auto SerMode = std::remove_reference<decltype(Ser)>::type::GetMode();
            PSOSerializer<SerMode>::SerializeAuxData(Ser, m_Data.Aux, nullptr);
        };

        {
            Serializer<SerializerMode::Measure> Ser;
            SerializePsoCI(Ser);
            m_Data.Common = Ser.AllocateData(GetRawAllocator());
        }

        {
            Serializer<SerializerMode::Write> Ser{m_Data.Common};
            SerializePsoCI(Ser);
            VERIFY_EXPR(Ser.IsEnded());
        }
    }

    m_Status.store(PIPELINE_STATE_STATUS_READY);
}